

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O0

void __thiscall
ConfidentialTransactionContext_SignWithPrivkeySimple_Test::TestBody
          (ConfidentialTransactionContext_SignWithPrivkeySimple_Test *this)

{
  bool bVar1;
  char *pcVar2;
  undefined1 extraout_DL;
  AssertionResult gtest_ar;
  ConfidentialTransactionContext ctx;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  AssertHelper local_270;
  Message local_268;
  string local_260 [32];
  AssertionResult local_240;
  AssertHelper local_230;
  Message local_228 [2];
  undefined8 local_218;
  undefined1 local_210;
  undefined8 local_208;
  undefined1 local_200;
  SigHashType local_1f8 [15];
  allocator local_1e9;
  string local_1e8 [32];
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [32];
  Pubkey local_180;
  allocator local_161;
  string local_160 [32];
  Txid local_140;
  OutPoint local_120;
  allocator local_e1;
  string local_e0 [32];
  ConfidentialTransactionContext local_c0 [192];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e0,
             "020000000101aca6c902e9569c99e172c22182f943e4ab15f28602ab248f65c864874a9ddc860000000000fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e0740000000000000000000000000000"
             ,&local_e1);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(local_c0,local_e0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_160,"86dc9d4a8764c8658f24ab0286f215abe443f98221c272e1999c56e902c9a6ac",
                 &local_161);
      cfd::core::Txid::Txid(&local_140,local_160);
      cfd::core::OutPoint::OutPoint(&local_120,&local_140,0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1a0,"02f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef",
                 &local_1a1);
      cfd::core::Pubkey::Pubkey(&local_180,local_1a0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1e8,"cRar5dsNEddUTgXuuhsq5p2NRJUKiV58PUHEPgGe1k9CW8CGRzbj",&local_1e9);
      cfd::core::Privkey::FromWif(local_1c8,(NetType)local_1e8,true);
      cfd::core::SigHashType::SigHashType(local_1f8);
      local_218 = cfd::core::Amount::CreateBySatoshiAmount(0xb2d065d0);
      in_stack_fffffffffffffd40 = 1;
      local_210 = extraout_DL;
      local_208 = local_218;
      local_200 = extraout_DL;
      cfd::ConfidentialTransactionContext::SignWithPrivkeySimple
                (local_c0,&local_120,&local_180,local_1c8,local_1f8,&local_208,6);
      cfd::core::Privkey::~Privkey((Privkey *)0x1ddd77);
      std::__cxx11::string::~string(local_1e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x1ddd9e);
      std::__cxx11::string::~string(local_1a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x1dddc5);
      cfd::core::Txid::~Txid((Txid *)0x1dddd2);
      std::__cxx11::string::~string(local_160);
      std::allocator<char>::~allocator((allocator<char> *)&local_161);
    }
  }
  else {
    testing::Message::Message(local_228);
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x1af,
               "Expected: ctx.SignWithPrivkeySimple( OutPoint(Txid(\"86dc9d4a8764c8658f24ab0286f215abe443f98221c272e1999c56e902c9a6ac\"), 0), Pubkey(\"02f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef\"), Privkey::FromWif(\"cRar5dsNEddUTgXuuhsq5p2NRJUKiV58PUHEPgGe1k9CW8CGRzbj\", NetType::kTestnet), SigHashType(), Amount::CreateBySatoshiAmount(3000002000), AddressType::kP2shP2wpkhAddress, true) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_230,local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    testing::Message::~Message((Message *)0x1de039);
  }
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_240,"ctx.GetHex().c_str()",
             "\"020000000101aca6c902e9569c99e172c22182f943e4ab15f28602ab248f65c864874a9ddc8600000000171600141da984b5779f27a59dfb3499bce3823bf1824941fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e074000000000000000002473044022004fec212010170716d8a72a54b30451a67bdb7619cc1c7a59fa0aff3c01b37b202204652c79b5472bc55e6af682710b815b44fc7fdf6c4520edf6339e750ea4ecd99012102f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef0000000000\""
             ,pcVar2,
             "020000000101aca6c902e9569c99e172c22182f943e4ab15f28602ab248f65c864874a9ddc8600000000171600141da984b5779f27a59dfb3499bce3823bf1824941fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e074000000000000000002473044022004fec212010170716d8a72a54b30451a67bdb7619cc1c7a59fa0aff3c01b37b202204652c79b5472bc55e6af682710b815b44fc7fdf6c4520edf6339e750ea4ecd99012102f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef0000000000"
            );
  std::__cxx11::string::~string(local_260);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_240);
  if (!bVar1) {
    testing::Message::Message(&local_268);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1de14a);
    testing::internal::AssertHelper::AssertHelper
              (&local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x1b0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_270,&local_268);
    testing::internal::AssertHelper::~AssertHelper(&local_270);
    testing::Message::~Message((Message *)0x1de198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1de1e7);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)
             CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, SignWithPrivkeySimple) {
  // P2shP2wpkh
  ConfidentialTransactionContext ctx("020000000101aca6c902e9569c99e172c22182f943e4ab15f28602ab248f65c864874a9ddc860000000000fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e0740000000000000000000000000000");

  EXPECT_NO_THROW(ctx.SignWithPrivkeySimple(
      OutPoint(Txid("86dc9d4a8764c8658f24ab0286f215abe443f98221c272e1999c56e902c9a6ac"), 0),
      Pubkey("02f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef"),
      Privkey::FromWif("cRar5dsNEddUTgXuuhsq5p2NRJUKiV58PUHEPgGe1k9CW8CGRzbj", NetType::kTestnet),
      SigHashType(), Amount::CreateBySatoshiAmount(3000002000),
      AddressType::kP2shP2wpkhAddress, true));
  EXPECT_STREQ(ctx.GetHex().c_str(), "020000000101aca6c902e9569c99e172c22182f943e4ab15f28602ab248f65c864874a9ddc8600000000171600141da984b5779f27a59dfb3499bce3823bf1824941fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e074000000000000000002473044022004fec212010170716d8a72a54b30451a67bdb7619cc1c7a59fa0aff3c01b37b202204652c79b5472bc55e6af682710b815b44fc7fdf6c4520edf6339e750ea4ecd99012102f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef0000000000");
}